

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O0

void __thiscall
rsg::
UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::SqrtOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::SqrtOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::SqrtOp>_>
::~UnaryBuiltinVecFunc
          (UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::SqrtOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::SqrtOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::SqrtOp>_>
           *this)

{
  UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::SqrtOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::SqrtOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::SqrtOp>_>
  *this_local;
  
  ~UnaryBuiltinVecFunc(this);
  operator_delete(this,200);
  return;
}

Assistant:

UnaryBuiltinVecFunc<GetValueRangeWeight, ComputeValueRange, Evaluate>::~UnaryBuiltinVecFunc (void)
{
	delete m_child;
}